

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void __thiscall NukedOPL3::Reset(NukedOPL3 *this)

{
  byte local_12;
  byte local_11;
  Bit8u channum;
  Bit8u slotnum;
  NukedOPL3 *this_local;
  
  memset(&this->opl3,0,0x1070);
  for (local_11 = 0; local_11 < 0x24; local_11 = local_11 + 1) {
    (this->opl3).slot[local_11].chip = &this->opl3;
    (this->opl3).slot[local_11].mod = &(this->opl3).zeromod;
    (this->opl3).slot[local_11].eg_rout = 0x1ff;
    (this->opl3).slot[local_11].eg_out = 0x1ff;
    (this->opl3).slot[local_11].eg_gen = '\0';
    (this->opl3).slot[local_11].trem = (Bit8u *)&(this->opl3).zeromod;
  }
  for (local_12 = 0; local_12 < 0x12; local_12 = local_12 + 1) {
    (this->opl3).channel[local_12].slots[0] = (this->opl3).slot + ""[local_12];
    (this->opl3).channel[local_12].slots[1] = (this->opl3).slot + (int)(""[local_12] + 3);
    (this->opl3).slot[""[local_12]].channel = (this->opl3).channel + local_12;
    (this->opl3).slot[(int)(""[local_12] + 3)].channel = (this->opl3).channel + local_12;
    if ((uint)local_12 % 9 < 3) {
      (this->opl3).channel[local_12].pair = (this->opl3).channel + (int)(local_12 + 3);
    }
    else if ((uint)local_12 % 9 < 6) {
      (this->opl3).channel[local_12].pair = (this->opl3).channel + (int)(local_12 - 3);
    }
    (this->opl3).channel[local_12].chip = &this->opl3;
    (this->opl3).channel[local_12].out[0] = &(this->opl3).zeromod;
    (this->opl3).channel[local_12].out[1] = &(this->opl3).zeromod;
    (this->opl3).channel[local_12].out[2] = &(this->opl3).zeromod;
    (this->opl3).channel[local_12].out[3] = &(this->opl3).zeromod;
    (this->opl3).channel[local_12].chtype = '\0';
    (this->opl3).channel[local_12].cha = 0xffff;
    (this->opl3).channel[local_12].chb = 0xffff;
    (this->opl3).channel[local_12].fcha = 1.0;
    (this->opl3).channel[local_12].fchb = 1.0;
    chan_setupalg((this->opl3).channel + local_12);
  }
  (this->opl3).noise = 0x306600;
  (this->opl3).timer = 0;
  (this->opl3).FullPan = this->FullPan & 1;
  return;
}

Assistant:

void NukedOPL3::Reset() {
	memset(&opl3, 0, sizeof(opl_chip));
	for (Bit8u slotnum = 0; slotnum < 36; slotnum++) {
		opl3.slot[slotnum].chip = &opl3;
		opl3.slot[slotnum].mod = &opl3.zeromod;
		opl3.slot[slotnum].eg_rout = 0x1ff;
		opl3.slot[slotnum].eg_out = 0x1ff;
		opl3.slot[slotnum].eg_gen = envelope_gen_num_off;
		opl3.slot[slotnum].trem = (Bit8u*)&opl3.zeromod;
	}
	for (Bit8u channum = 0; channum < 18; channum++) {
		opl3.channel[channum].slots[0] = &opl3.slot[ch_slot[channum]];
		opl3.channel[channum].slots[1] = &opl3.slot[ch_slot[channum] + 3];
		opl3.slot[ch_slot[channum]].channel = &opl3.channel[channum];
		opl3.slot[ch_slot[channum] + 3].channel = &opl3.channel[channum];
		if ((channum % 9) < 3) {
			opl3.channel[channum].pair = &opl3.channel[channum + 3];
		}
		else if ((channum % 9) < 6) {
			opl3.channel[channum].pair = &opl3.channel[channum - 3];
		}
		opl3.channel[channum].chip = &opl3;
		opl3.channel[channum].out[0] = &opl3.zeromod;
		opl3.channel[channum].out[1] = &opl3.zeromod;
		opl3.channel[channum].out[2] = &opl3.zeromod;
		opl3.channel[channum].out[3] = &opl3.zeromod;
		opl3.channel[channum].chtype = ch_2op;
		opl3.channel[channum].cha = ~0;
		opl3.channel[channum].chb = ~0;
		opl3.channel[channum].fcha = 1.0;
		opl3.channel[channum].fchb = 1.0;
		chan_setupalg(&opl3.channel[channum]);
	}
	opl3.noise = 0x306600;
	opl3.timer = 0;
	opl3.FullPan = FullPan;
}